

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

optional<metaf::Pressure> metaf::Pressure::fromQfeString(string *s)

{
  char *pcVar1;
  optional<unsigned_int> oVar2;
  optional<unsigned_int> oVar3;
  ulong uVar4;
  undefined8 uVar5;
  optional<metaf::Pressure> oVar6;
  
  uVar4 = 0x100000000;
  if ((((s->_M_string_length == 0xb) || (s->_M_string_length == 6)) &&
      (pcVar1 = (s->_M_dataplus)._M_p, *pcVar1 == 'Q')) &&
     ((pcVar1[1] == 'F' && (pcVar1[2] == 'E')))) {
    oVar2 = strToUint(s,3,3);
    if (((ulong)oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> & 0x100000000) != 0) {
      if (s->_M_string_length == 0xb) {
        oVar3 = strToUint(s,7,4);
        if ((((ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_int> & 0x100000000) == 0) ||
           ((s->_M_dataplus)._M_p[6] != '/')) goto LAB_00190897;
      }
      uVar4 = (ulong)(uint)(float)((ulong)oVar2.super__Optional_base<unsigned_int,_true,_true>.
                                          _M_payload.super__Optional_payload_base<unsigned_int> &
                                  0xffffffff) | 0x100000000;
      uVar5 = 0x100000002;
      goto LAB_00190899;
    }
  }
LAB_00190897:
  uVar5 = 0;
LAB_00190899:
  oVar6.super__Optional_base<metaf::Pressure,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Pressure>._8_8_ = uVar5;
  oVar6.super__Optional_base<metaf::Pressure,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Pressure>._M_payload._M_value.pressureValue.
  super__Optional_base<float,_true,_true>._M_payload.super__Optional_payload_base<float> =
       (optional<float>)(optional<float>)uVar4;
  return (optional<metaf::Pressure>)
         oVar6.super__Optional_base<metaf::Pressure,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::Pressure>;
}

Assistant:

std::optional<Pressure> Pressure::fromQfeString(const std::string & s) {
	//static const std::regex rgx("QFE(\\d\\d\\d)(/\\d\\d\\d\\d)?");
	static const std::optional<Pressure> error;
	if (s.length() != 6 && s.length() != 11) return error;
	if (s[0] != 'Q' || s[1] != 'F' || s[2] != 'E') return error;
	const auto mmHg = strToUint(s, 3, 3);
	if (!mmHg.has_value()) return error;
	if (s.length() == 11) {
		const auto hPa = strToUint(s, 7, 4);
		if (!hPa.has_value() || s[6] != '/') return error;
		//Value in hPa is ignored (parsed only for group syntax check)
	}
	Pressure pressure;
	pressure.pressureUnit = Unit::MM_HG;
	pressure.pressureValue = *mmHg;
	return pressure;
}